

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

bool spectest::CheckIR(string *filename,bool validate)

{
  Result RVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  bool bVar2;
  string_view filename_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  Module module;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_478;
  Errors local_458;
  Features local_438;
  ReadBinaryOptions local_418;
  Module local_3f0;
  
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filename_00._M_str = (char *)&local_478;
  filename_00._M_len = (size_t)(filename->_M_dataplus)._M_p;
  RVar1 = wabt::ReadFile((wabt *)filename->_M_string_length,filename_00,in_RCX);
  if (RVar1.enum_ == Error) {
    bVar2 = false;
  }
  else {
    local_418.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_418.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_418.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_418.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_418.features.simd_enabled_ = s_features.simd_enabled_;
    local_418.features.threads_enabled_ = s_features.threads_enabled_;
    local_418.features.function_references_enabled_ = s_features.function_references_enabled_;
    local_418.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_418.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_418.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_418.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_418.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_418.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    local_418.features.gc_enabled_ = s_features.gc_enabled_;
    local_418.features.memory64_enabled_ = s_features.memory64_enabled_;
    local_418.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    local_418.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    local_418.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    local_418.features.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
    local_418.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_418.read_debug_names = true;
    local_418.stop_on_first_error = true;
    local_418.fail_on_custom_section_error = true;
    local_418.skip_function_bodies = false;
    local_458.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_458.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wabt::Module::Module(&local_3f0);
    RVar1 = wabt::ReadBinaryIr((filename->_M_dataplus)._M_p,
                               local_478._M_impl.super__Vector_impl_data._M_start,
                               (long)local_478._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_478._M_impl.super__Vector_impl_data._M_start,&local_418,
                               &local_458,&local_3f0);
    bVar2 = RVar1.enum_ != Error;
    if (validate && bVar2) {
      local_438.exceptions_enabled_ = s_features.exceptions_enabled_;
      local_438.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      local_438.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      local_438.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      local_438.simd_enabled_ = s_features.simd_enabled_;
      local_438.threads_enabled_ = s_features.threads_enabled_;
      local_438.function_references_enabled_ = s_features.function_references_enabled_;
      local_438.multi_value_enabled_ = s_features.multi_value_enabled_;
      local_438.tail_call_enabled_ = s_features.tail_call_enabled_;
      local_438.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      local_438.reference_types_enabled_ = s_features.reference_types_enabled_;
      local_438.annotations_enabled_ = s_features.annotations_enabled_;
      local_438.code_metadata_enabled_ = s_features.code_metadata_enabled_;
      local_438.gc_enabled_ = s_features.gc_enabled_;
      local_438.memory64_enabled_ = s_features.memory64_enabled_;
      local_438.multi_memory_enabled_ = s_features.multi_memory_enabled_;
      local_438.extended_const_enabled_ = s_features.extended_const_enabled_;
      local_438.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
      local_438.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
      RVar1 = wabt::ValidateModule(&local_3f0,&local_458,(ValidateOptions *)&local_438);
      bVar2 = RVar1.enum_ == Ok;
    }
    wabt::Module::~Module(&local_3f0);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_458);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_478);
  return bVar2;
}

Assistant:

bool CheckIR(const std::string& filename, bool validate) {
  std::vector<uint8_t> file_data;

  if (Failed(ReadFile(filename, &file_data))) {
    return false;
  }

  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  Errors errors;
  wabt::Module module;
  if (Failed(ReadBinaryIr(filename.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module))) {
    return false;
  }

  if (!validate) {
    return true;
  }

  return Succeeded(
      ValidateModule(&module, &errors, ValidateOptions{s_features}));
}